

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

vm_tadsobj_hdr * vm_tadsobj_hdr::expand(CVmObjTads *self,vm_tadsobj_hdr *hdr)

{
  vm_tadsobj_hdr *pvVar1;
  unsigned_short prop_cnt;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  vm_tadsobj_hdr *in_stack_00000028;
  CVmObjTads *in_stack_00000030;
  
  pvVar1 = expand_to(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  return pvVar1;
}

Assistant:

vm_tadsobj_hdr *vm_tadsobj_hdr::expand(VMG_ CVmObjTads *self,
                                       vm_tadsobj_hdr *hdr)
{
    unsigned short prop_cnt;

    /* 
     *   Move up to the next property count increment.  If we're not huge,
     *   simply double the current size.  If we're getting large, expand by
     *   50%.  
     */
    prop_cnt = hdr->prop_entry_cnt;
    if (prop_cnt <= 128)
        prop_cnt *= 2;
    else
        prop_cnt += prop_cnt/2;

    /* expand to the new size */
    return expand_to(vmg_ self, hdr, hdr->sc_cnt, prop_cnt);
}